

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseFieldWithExtensionInfo<google::protobuf::internal::InternalMetadataWithArena>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadataWithArena *metadata,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  EpsCopyInputStream *this_00;
  MessageLite *pMVar4;
  undefined4 extraout_var;
  ParseContext *this_01;
  byte *in_RCX;
  void *data;
  undefined1 in_DL;
  int in_ESI;
  FieldDescriptor *in_RDI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_R8;
  char *in_R9;
  EpsCopyInputStream *in_stack_00000008;
  MessageLite *value_16;
  uint32 tag;
  MessageLite *value_15;
  int size;
  string *value_14;
  int value_13;
  uint64 val_2;
  bool value_12;
  double value_11;
  float value_10;
  long value_9;
  int value_8;
  unsigned_long value_7;
  uint value_6;
  int64 value_5;
  uint64 val_1;
  int32 value_4;
  uint64 val;
  uint64 value_3;
  uint64 value_2;
  uint64 value_1;
  uint64 value;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  LogMessage *in_stack_fffffffffffffe30;
  uint32 num;
  char *in_stack_fffffffffffffe38;
  LogMessage *in_stack_fffffffffffffe40;
  char **in_stack_fffffffffffffe58;
  InternalMetadataWithArena *in_stack_fffffffffffffe78;
  ParseContext *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  void *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeb0;
  undefined4 local_140;
  uint64 local_f8;
  uint32 local_e8;
  FieldDescriptor *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  undefined2 in_stack_ffffffffffffff38;
  bool in_stack_ffffffffffffff3a;
  FieldType in_stack_ffffffffffffff3b;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  FieldType type;
  int in_stack_ffffffffffffff44;
  ExtensionSet *in_stack_ffffffffffffff48;
  FieldDescriptor *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  ExtensionSet *in_stack_ffffffffffffff68;
  FieldType in_stack_ffffffffffffff73;
  int in_stack_ffffffffffffff74;
  ExtensionSet *in_stack_ffffffffffffff78;
  undefined3 in_stack_ffffffffffffffa0;
  uint uVar5;
  int32 value_17;
  undefined8 in_stack_ffffffffffffffb0;
  ExtensionSet *in_stack_ffffffffffffffb8;
  char *local_8;
  
  uVar5 = CONCAT13(in_DL,in_stack_ffffffffffffffa0) & 0x1ffffff;
  local_8 = in_R9;
  if ((char)(uVar5 >> 0x18) == '\0') {
    type = (FieldType)((uint)in_stack_ffffffffffffff40 >> 0x18);
    switch(*in_RCX) {
    case 1:
      UnalignedLoad<double>((char *)in_stack_fffffffffffffe30);
      local_8 = in_R9 + 8;
      if ((in_RCX[1] & 1) == 0) {
        SetDouble((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                  (double)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff28);
      }
      else {
        AddDouble(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                  (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                  SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(double)in_RDI,
                  (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
      }
      break;
    case 2:
      UnalignedLoad<float>((char *)in_stack_fffffffffffffe30);
      local_8 = in_R9 + 4;
      if ((in_RCX[1] & 1) == 0) {
        SetFloat((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff34,
                 in_stack_ffffffffffffff28);
      }
      else {
        AddFloat(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                 (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                 SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(float)((ulong)in_RDI >> 0x20),
                 (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
      }
      break;
    case 3:
      local_8 = VarintParse<unsigned_long>
                          (in_stack_fffffffffffffe38,(unsigned_long *)in_stack_fffffffffffffe30);
      if (local_8 == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else if ((in_RCX[1] & 1) == 0) {
        SetInt64((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      }
      else {
        AddInt64(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                 (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                 SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(int64)in_RDI,
                 (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
      }
      break;
    case 4:
      local_8 = VarintParse<unsigned_long>
                          (in_stack_fffffffffffffe38,(unsigned_long *)in_stack_fffffffffffffe30);
      if (local_8 == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else if ((in_RCX[1] & 1) == 0) {
        SetUInt64((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                  CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff28);
      }
      else {
        AddUInt64(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                  (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                  SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(uint64)in_RDI,
                  (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
      }
      break;
    case 5:
      local_8 = VarintParse<unsigned_long>
                          (in_stack_fffffffffffffe38,(unsigned_long *)in_stack_fffffffffffffe30);
      if (local_8 == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else if ((in_RCX[1] & 1) == 0) {
        SetInt32((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                 (int32)in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
      }
      else {
        AddInt32(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                 (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                 SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(int32)((ulong)in_RDI >> 0x20),
                 (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
      }
      break;
    case 6:
      UnalignedLoad<unsigned_long>((char *)in_stack_fffffffffffffe30);
      local_8 = in_R9 + 8;
      if ((in_RCX[1] & 1) == 0) {
        SetUInt64((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                  CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff28);
      }
      else {
        AddUInt64(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                  (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                  SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(uint64)in_RDI,
                  (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
      }
      break;
    case 7:
      UnalignedLoad<unsigned_int>((char *)in_stack_fffffffffffffe30);
      local_8 = in_R9 + 4;
      if ((in_RCX[1] & 1) == 0) {
        SetUInt32((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                  (uint32)in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
      }
      else {
        AddUInt32(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                  (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                  SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(uint32)((ulong)in_RDI >> 0x20),
                  (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
      }
      break;
    case 8:
      UnalignedLoad<bool>((char *)in_stack_fffffffffffffe30);
      local_8 = in_R9 + 1;
      if ((in_RCX[1] & 1) == 0) {
        SetBool((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
      else {
        AddBool(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),
                SUB81((ulong)in_stack_ffffffffffffffb0 >> 8,0),in_RDI);
      }
      break;
    case 9:
    case 0xc:
      if ((in_RCX[1] & 1) == 0) {
        this_00 = (EpsCopyInputStream *)
                  MutableString_abi_cxx11_
                            ((ExtensionSet *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff5c,
                             (FieldType)((uint)in_stack_ffffffffffffff58 >> 0x18),
                             in_stack_ffffffffffffff50);
        iVar2 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      }
      else {
        this_00 = (EpsCopyInputStream *)
                  AddString_abi_cxx11_
                            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                             (FieldType)((uint)in_stack_ffffffffffffff60 >> 0x18),
                             (FieldDescriptor *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        iVar2 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      }
      ReadSize(in_stack_fffffffffffffe58);
      if (in_R9 == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        local_8 = EpsCopyInputStream::ReadString
                            (this_00,(char *)in_stack_fffffffffffffe40,iVar2,
                             (string *)in_stack_fffffffffffffe30);
      }
      break;
    case 10:
      if ((in_RCX[1] & 1) == 0) {
        pMVar4 = MutableMessage(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,type,
                                (MessageLite *)
                                CONCAT44(in_stack_ffffffffffffff3c,
                                         CONCAT13(in_stack_ffffffffffffff3b,
                                                  CONCAT12(in_stack_ffffffffffffff3a,
                                                           in_stack_ffffffffffffff38))),
                                (FieldDescriptor *)
                                CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
      else {
        pMVar4 = AddMessage(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                            in_stack_ffffffffffffff73,(MessageLite *)in_stack_ffffffffffffff68,
                            (FieldDescriptor *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      iVar2 = *(int *)&in_stack_00000008[1].limit_end_ + -1;
      *(int *)&in_stack_00000008[1].limit_end_ = iVar2;
      if (iVar2 < 0) {
        local_8 = (char *)0x0;
      }
      else {
        *(int *)((long)&in_stack_00000008[1].limit_end_ + 4) =
             *(int *)((long)&in_stack_00000008[1].limit_end_ + 4) + 1;
        iVar2 = (*pMVar4->_vptr_MessageLite[0xd])(pMVar4,in_R9);
        local_8 = (char *)CONCAT44(extraout_var,iVar2);
        *(int *)((long)&in_stack_00000008[1].limit_end_ + 4) =
             *(int *)((long)&in_stack_00000008[1].limit_end_ + 4) + -1;
        *(int *)&in_stack_00000008[1].limit_end_ = *(int *)&in_stack_00000008[1].limit_end_ + 1;
        bVar1 = EpsCopyInputStream::ConsumeEndGroup(in_stack_00000008,in_ESI * 8 + 3);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          local_8 = (char *)0x0;
        }
      }
      break;
    case 0xb:
      if ((in_RCX[1] & 1) == 0) {
        this_01 = (ParseContext *)
                  MutableMessage(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,type,
                                 (MessageLite *)
                                 CONCAT44(in_stack_ffffffffffffff3c,
                                          CONCAT13(in_stack_ffffffffffffff3b,
                                                   CONCAT12(in_stack_ffffffffffffff3a,
                                                            in_stack_ffffffffffffff38))),
                                 (FieldDescriptor *)
                                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
      else {
        this_01 = (ParseContext *)
                  AddMessage(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                             in_stack_ffffffffffffff73,(MessageLite *)in_stack_ffffffffffffff68,
                             (FieldDescriptor *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      local_8 = ParseContext::ParseMessage
                          (this_01,(MessageLite *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (char *)0x6cc573);
      break;
    case 0xd:
      local_8 = VarintParse<unsigned_long>
                          (in_stack_fffffffffffffe38,(unsigned_long *)in_stack_fffffffffffffe30);
      if (local_8 == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else if ((in_RCX[1] & 1) == 0) {
        SetUInt32((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                  (uint32)in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
      }
      else {
        AddUInt32(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                  (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                  SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(uint32)((ulong)in_RDI >> 0x20),
                  (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
      }
      break;
    case 0xe:
      local_8 = VarintParse<unsigned_long>
                          (in_stack_fffffffffffffe38,(unsigned_long *)in_stack_fffffffffffffe30);
      num = (uint32)((ulong)in_stack_fffffffffffffe30 >> 0x20);
      iVar2 = (int)((ulong)in_RDI >> 0x20);
      if (local_8 == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        uVar3 = (**(code **)(in_RCX + 8))(*(undefined8 *)(in_RCX + 0x10),local_140);
        if ((uVar3 & 1) == 0) {
          if (((uint)*(undefined8 *)in_R8 & 1) == 1) {
            InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
            ::
            PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                      (in_R8);
          }
          else {
            InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
            ::mutable_unknown_fields_slow
                      ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        *)in_R8);
          }
          WriteVarint(num,CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                      (UnknownFieldSet *)0x6cc215);
        }
        else if ((in_RCX[1] & 1) == 0) {
          SetEnum((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,(int)in_stack_ffffffffffffff34
                  ,in_stack_ffffffffffffff28);
        }
        else {
          AddEnum(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                  (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                  SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),iVar2,
                  (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
        }
      }
      break;
    case 0xf:
      UnalignedLoad<int>((char *)in_stack_fffffffffffffe30);
      local_8 = in_R9 + 4;
      if ((in_RCX[1] & 1) == 0) {
        SetInt32((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                 (int32)in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
      }
      else {
        AddInt32(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                 (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                 SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(int32)((ulong)in_RDI >> 0x20),
                 (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
      }
      break;
    case 0x10:
      UnalignedLoad<long>((char *)in_stack_fffffffffffffe30);
      local_8 = in_R9 + 8;
      if ((in_RCX[1] & 1) == 0) {
        SetInt64((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      }
      else {
        AddInt64(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                 (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                 SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(int64)in_RDI,
                 (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
      }
      break;
    case 0x11:
      local_8 = VarintParse<unsigned_long>
                          (in_stack_fffffffffffffe38,(unsigned_long *)in_stack_fffffffffffffe30);
      value_17 = (int32)((ulong)in_RDI >> 0x20);
      if (local_8 == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        WireFormatLite::ZigZagDecode32(local_e8);
        if ((in_RCX[1] & 1) == 0) {
          SetInt32((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                   (int32)in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
        }
        else {
          AddInt32(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                   (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                   SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),value_17,
                   (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
        }
      }
      break;
    case 0x12:
      local_8 = VarintParse<unsigned_long>
                          (in_stack_fffffffffffffe38,(unsigned_long *)in_stack_fffffffffffffe30);
      if (local_8 == (char *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        WireFormatLite::ZigZagDecode64(local_f8);
        if ((in_RCX[1] & 1) == 0) {
          SetInt64((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff28);
        }
        else {
          AddInt64(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                   (FieldType)((ulong)in_stack_ffffffffffffffb0 >> 0x18),
                   SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x10,0),(int64)in_RDI,
                   (FieldDescriptor *)CONCAT44(in_ESI,uVar5));
        }
      }
    }
  }
  else {
    data = (void *)(ulong)(*in_RCX - 1);
    switch(data) {
    case (void *)0x0:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedDoubleParser(in_stack_fffffffffffffe30,
                                   (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                    in_stack_fffffffffffffe28),
                                   (ParseContext *)0x6cb675);
      break;
    case (void *)0x1:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedFloatParser(in_stack_fffffffffffffe30,
                                  (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                   in_stack_fffffffffffffe28),
                                  (ParseContext *)0x6cb616);
      break;
    case (void *)0x2:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedInt64Parser(in_stack_fffffffffffffe30,
                                  (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                   in_stack_fffffffffffffe28),
                                  (ParseContext *)0x6cb2bf);
      break;
    case (void *)0x3:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedUInt64Parser(in_stack_fffffffffffffe30,
                                   (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                    in_stack_fffffffffffffe28),
                                   (ParseContext *)0x6cb37d);
      break;
    case (void *)0x4:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedInt32Parser(in_stack_fffffffffffffe30,
                                  (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                   in_stack_fffffffffffffe28),
                                  (ParseContext *)0x6cb260);
      break;
    case (void *)0x5:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedFixed64Parser(in_stack_fffffffffffffe30,
                                    (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                     in_stack_fffffffffffffe28),
                                    (ParseContext *)0x6cb4f9);
      break;
    case (void *)0x6:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedFixed32Parser(in_stack_fffffffffffffe30,
                                    (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                     in_stack_fffffffffffffe28),
                                    (ParseContext *)0x6cb49a);
      break;
    case (void *)0x7:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedBoolParser(in_stack_fffffffffffffe30,
                                 (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                  in_stack_fffffffffffffe28),
                                 (ParseContext *)0x6cb6d4);
      break;
    case (void *)0x8:
    case (void *)0x9:
    case (void *)0xa:
    case (void *)0xb:
      LogMessage::LogMessage
                (in_stack_fffffffffffffe40,(LogLevel)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      LogMessage::operator<<
                (in_stack_fffffffffffffe30,
                 (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffe30,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      LogMessage::~LogMessage((LogMessage *)0x6cb7c6);
      break;
    case (void *)0xc:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedUInt32Parser(in_stack_fffffffffffffe30,
                                   (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                    in_stack_fffffffffffffe28),
                                   (ParseContext *)0x6cb31e);
      break;
    case (void *)0xd:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedEnumParserArg(in_stack_fffffffffffffea0,
                                    (char *)CONCAT44(in_stack_fffffffffffffe9c,
                                                     in_stack_fffffffffffffe98),
                                    in_stack_fffffffffffffe90,(_func_bool_void_ptr_int *)in_RDI,data
                                    ,in_stack_fffffffffffffe78,in_stack_fffffffffffffeb0);
      break;
    case (void *)0xe:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedSFixed32Parser
                          (in_stack_fffffffffffffe30,
                           (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (ParseContext *)0x6cb558);
      break;
    case (void *)0xf:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedSFixed64Parser
                          (in_stack_fffffffffffffe30,
                           (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                           (ParseContext *)0x6cb5b7);
      break;
    case (void *)0x10:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedSInt32Parser(in_stack_fffffffffffffe30,
                                   (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                    in_stack_fffffffffffffe28),
                                   (ParseContext *)0x6cb3dc);
      break;
    case (void *)0x11:
      MutableRawRepeatedField
                ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3b,in_stack_ffffffffffffff3a,
                 (FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_8 = PackedSInt64Parser(in_stack_fffffffffffffe30,
                                   (char *)CONCAT44(in_stack_fffffffffffffe2c,
                                                    in_stack_fffffffffffffe28),
                                   (ParseContext *)0x6cb43b);
    }
  }
  return local_8;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    T* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check.func,
            extension.enum_validity_check.arg, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64 value;                                                           \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64 val;                                                             \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
      HANDLE_FIXED_TYPE(BOOL, Bool, bool);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64 val;
        ptr = VarintParse(ptr, &val);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = val;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          WriteVarint(number, val, metadata->mutable_unknown_fields());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32 tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}